

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_resolv_check(Curl_easy *data,Curl_dns_entry **dns)

{
  Curl_dns_entry *pCVar1;
  CURLcode local_24;
  CURLcode result;
  Curl_dns_entry **dns_local;
  Curl_easy *data_local;
  
  if ((data->state).async.hostname == (char *)0x0) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    pCVar1 = Curl_dnscache_get(data,(data->state).async.hostname,(data->state).async.port,
                               (data->state).async.ip_version);
    *dns = pCVar1;
    if (*dns == (Curl_dns_entry *)0x0) {
      if (((ulong)data->conn->bits >> 0x19 & 1) == 0) {
        local_24 = Curl_async_is_resolved(data,dns);
      }
      else {
        local_24 = Curl_doh_is_resolved(data,dns);
      }
      if (*dns != (Curl_dns_entry *)0x0) {
        show_resolve_info(data,*dns);
      }
      data_local._4_4_ = local_24;
    }
    else {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"Hostname \'%s\' was found in DNS cache",(data->state).async.hostname);
      }
      Curl_async_shutdown(data);
      (data->state).async.dns = *dns;
      (data->state).async.field_0x28 = (data->state).async.field_0x28 & 0xfe | 1;
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_resolv_check(struct Curl_easy *data,
                           struct Curl_dns_entry **dns)
{
  CURLcode result;

  /* If async resolving is ongoing, this must be set */
  if(!data->state.async.hostname)
    return CURLE_FAILED_INIT;

  /* check if we have the name resolved by now (from someone else) */
  *dns = Curl_dnscache_get(data, data->state.async.hostname,
                           data->state.async.port,
                           data->state.async.ip_version);
  if(*dns) {
    /* Tell a possibly async resolver we no longer need the results. */
    infof(data, "Hostname '%s' was found in DNS cache",
          data->state.async.hostname);
    Curl_async_shutdown(data);
    data->state.async.dns = *dns;
    data->state.async.done = TRUE;
    return CURLE_OK;
  }

#ifndef CURL_DISABLE_DOH
  if(data->conn->bits.doh) {
    result = Curl_doh_is_resolved(data, dns);
  }
  else
#endif
  result = Curl_async_is_resolved(data, dns);
  if(*dns)
    show_resolve_info(data, *dns);
  return result;
}